

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

void zddFixTree(DdManager *table,MtrNode *treenode)

{
  MtrNode *pMVar1;
  uint uVar2;
  
  if (treenode != (MtrNode *)0x0) {
    uVar2 = treenode->index;
    if ((int)uVar2 < table->sizeZ) {
      uVar2 = table->permZ[uVar2];
    }
    treenode->low = uVar2;
    if (treenode->child != (MtrNode *)0x0) {
      zddFixTree(table,treenode->child);
    }
    if (treenode->younger != (MtrNode *)0x0) {
      zddFixTree(table,treenode->younger);
    }
    pMVar1 = treenode->parent;
    if ((pMVar1 != (MtrNode *)0x0) && (treenode->low < pMVar1->low)) {
      pMVar1->low = treenode->low;
      pMVar1->index = treenode->index;
    }
  }
  return;
}

Assistant:

static void
zddFixTree(
  DdManager * table,
  MtrNode * treenode)
{
    if (treenode == NULL) return;
    treenode->low = ((int) treenode->index < table->sizeZ) ?
        table->permZ[treenode->index] : treenode->index;
    if (treenode->child != NULL) {
        zddFixTree(table, treenode->child);
    }
    if (treenode->younger != NULL)
        zddFixTree(table, treenode->younger);
    if (treenode->parent != NULL && treenode->low < treenode->parent->low) {
        treenode->parent->low = treenode->low;
        treenode->parent->index = treenode->index;
    }
    return;

}